

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_key_derivation_input_internal
          (psa_key_derivation_operation_t *operation,psa_key_derivation_step_t step,
          psa_key_type_t key_type,uint8_t *data,size_t data_length)

{
  psa_algorithm_t pVar1;
  int local_34;
  psa_algorithm_t kdf_alg;
  psa_status_t status;
  size_t data_length_local;
  uint8_t *data_local;
  psa_key_type_t key_type_local;
  psa_key_derivation_step_t step_local;
  psa_key_derivation_operation_t *operation_local;
  
  pVar1 = psa_key_derivation_get_kdf_alg(operation);
  local_34 = psa_key_derivation_check_input_type(step,key_type);
  if (local_34 == 0) {
    if ((pVar1 & 0xffffff00) == 0x20000100) {
      local_34 = psa_hkdf_input(&(operation->ctx).hkdf,pVar1 & 0xff | 0x1000000,step,data,
                                data_length);
    }
    else if ((pVar1 & 0xffffff00) == 0x20000200) {
      local_34 = psa_tls12_prf_input(&(operation->ctx).tls12_prf,pVar1 & 0xff | 0x1000000,step,data,
                                     data_length);
    }
    else {
      if ((pVar1 & 0xffffff00) != 0x20000300) {
        return -0x89;
      }
      local_34 = psa_tls12_prf_psk_to_ms_input
                           (&(operation->ctx).tls12_prf,pVar1 & 0xff | 0x1000000,step,data,
                            data_length);
    }
  }
  if (local_34 != 0) {
    psa_key_derivation_abort(operation);
  }
  return local_34;
}

Assistant:

static psa_status_t psa_key_derivation_input_internal(
    psa_key_derivation_operation_t *operation,
    psa_key_derivation_step_t step,
    psa_key_type_t key_type,
    const uint8_t *data,
    size_t data_length )
{
    psa_status_t status;
    psa_algorithm_t kdf_alg = psa_key_derivation_get_kdf_alg( operation );

    status = psa_key_derivation_check_input_type( step, key_type );
    if( status != PSA_SUCCESS )
        goto exit;

#if defined(MBEDTLS_MD_C)
    if( PSA_ALG_IS_HKDF( kdf_alg ) )
    {
        status = psa_hkdf_input( &operation->ctx.hkdf,
                                 PSA_ALG_HKDF_GET_HASH( kdf_alg ),
                                 step, data, data_length );
    }
    else if( PSA_ALG_IS_TLS12_PRF( kdf_alg ) )
    {
        status = psa_tls12_prf_input( &operation->ctx.tls12_prf,
                                      PSA_ALG_HKDF_GET_HASH( kdf_alg ),
                                      step, data, data_length );
    }
    else if( PSA_ALG_IS_TLS12_PSK_TO_MS( kdf_alg ) )
    {
        status = psa_tls12_prf_psk_to_ms_input( &operation->ctx.tls12_prf,
                                                PSA_ALG_HKDF_GET_HASH( kdf_alg ),
                                                step, data, data_length );
    }
    else
#endif /* MBEDTLS_MD_C */
    {
        /* This can't happen unless the operation object was not initialized */
        return( PSA_ERROR_BAD_STATE );
    }

exit:
    if( status != PSA_SUCCESS )
        psa_key_derivation_abort( operation );
    return( status );
}